

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O1

bool __thiscall UnifiedRegex::RegexPattern::IsDotAll(RegexPattern *this)

{
  bool bVar1;
  
  if (((((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
      threadConfig)->m_ES2018RegExDotAll == true) {
    bVar1 = (bool)((((this->rep).unified.program.ptr)->flags & DotAllRegexFlag) >> 5);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RegexPattern::IsDotAll() const
    {
        return GetScriptContext()->GetConfig()->IsES2018RegExDotAllEnabled() && (rep.unified.program->flags & DotAllRegexFlag) != 0;
    }